

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libc.cpp
# Opt level: O0

string * get_libc_version_abi_cxx11_(void)

{
  char *__s;
  string *in_RDI;
  string local_130;
  string local_110;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  undefined1 local_11;
  string *v;
  
  local_11 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  __s = (char *)gnu_get_libc_version();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,__s,&local_d9);
  std::operator+(&local_b8,"GCC: runtime ",&local_d8);
  std::operator+(&local_98,&local_b8,", compile-time ");
  std::__cxx11::to_string(&local_110,2);
  std::operator+(&local_78,&local_98,&local_110);
  std::operator+(&local_58,&local_78,".");
  std::__cxx11::to_string(&local_130,0x23);
  std::operator+(&local_38,&local_58,&local_130);
  std::__cxx11::string::operator=((string *)in_RDI,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  return in_RDI;
}

Assistant:

std::string get_libc_version(){

std::string v;

#if defined(__UCLIBC__)
v = "uClibc: " + std::string(__UCLIBC__);
#elif defined(__GLIBC__)
v = "GCC: runtime " + std::string(gnu_get_libc_version()) + ", compile-time " + std::to_string(__GLIBC__) + "." + std::to_string(__GLIBC_MINOR__);
#elif defined(__apple_build_version__)
v = "Apple";
#elif defined(_MSC_VER)
v = "Microsoft " + std::to_string(_MSC_VER);
#endif

return v;
}